

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
::process_transition_event<afsm::test::events::power_on>
          (state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
           *this,power_on *event)

{
  event_process_result eVar1;
  transition_table_type<afsm::test::events::power_on> *this_00;
  size_t __n;
  const_reference this_01;
  indexes_tuple<0UL,_1UL> local_21;
  transition_table_type<afsm::test::events::power_on> *local_20;
  transition_table_type<afsm::test::events::power_on> *inv_table;
  power_on *event_local;
  state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
  *this_local;
  
  inv_table = (transition_table_type<afsm::test::events::power_on> *)event;
  event_local = (power_on *)this;
  this_00 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
            ::transition_table<afsm::test::events::power_on,0ul,1ul>(&local_21);
  local_20 = this_00;
  __n = current_state(this);
  this_01 = std::
            array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>_&,_afsm::test::events::power_on_&&)>,_2UL>
            ::operator[](this_00,__n);
  eVar1 = std::
          function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>_&,_afsm::test::events::power_on_&&)>
          ::operator()(this_01,this,(power_on *)inv_table);
  return eVar1;
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }